

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_AddDeleteTest_Test::
~ComparisonTest_AddDeleteTest_Test(ComparisonTest_AddDeleteTest_Test *this)

{
  ComparisonTest_AddDeleteTest_Test *this_local;
  
  ComparisonTest::~ComparisonTest(&this->super_ComparisonTest);
  return;
}

Assistant:

TEST_F(ComparisonTest, AddDeleteTest) {
  proto1_.clear_optional_int32();
  proto2_.clear_optional_int64();

  EXPECT_EQ(
      "added: optional_int32: 101\n"
      "deleted: optional_int64: 102\n",
      Run());
}